

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_common.h
# Opt level: O0

int get_br_ctx_2d(uint8_t *levels,int c,int bhl)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  int local_44;
  uint local_40;
  uint local_38;
  uint local_30;
  int mag;
  int pos;
  int stride;
  int row;
  int col;
  int bhl_local;
  int c_local;
  uint8_t *levels_local;
  int local_4;
  
  bVar5 = (byte)bhl;
  uVar1 = c >> (bVar5 & 0x1f);
  uVar2 = c - (uVar1 << (bVar5 & 0x1f));
  iVar3 = (1 << (bVar5 & 0x1f)) + 4;
  iVar4 = uVar1 * iVar3 + uVar2;
  if (levels[iVar4 + 1] < 0xf) {
    local_30 = (uint)levels[iVar4 + 1];
  }
  else {
    local_30 = 0xf;
  }
  if (levels[iVar4 + iVar3] < 0xf) {
    local_38 = (uint)levels[iVar4 + iVar3];
  }
  else {
    local_38 = 0xf;
  }
  if (levels[iVar4 + 1 + iVar3] < 0xf) {
    local_40 = (uint)levels[iVar4 + 1 + iVar3];
  }
  else {
    local_40 = 0xf;
  }
  iVar3 = local_30 + local_38 + local_40;
  if ((uint)(iVar3 + 1 >> 1) < 6) {
    local_44 = iVar3 + 1 >> 1;
  }
  else {
    local_44 = 6;
  }
  if ((int)(uVar2 | uVar1) < 2) {
    local_4 = local_44 + 7;
  }
  else {
    local_4 = local_44 + 0xe;
  }
  return local_4;
}

Assistant:

static inline int get_br_ctx_2d(const uint8_t *const levels,
                                const int c,  // raster order
                                const int bhl) {
  assert(c > 0);
  const int col = c >> bhl;
  const int row = c - (col << bhl);
  const int stride = (1 << bhl) + TX_PAD_HOR;
  const int pos = col * stride + row;
  int mag = AOMMIN(levels[pos + 1], MAX_BASE_BR_RANGE) +
            AOMMIN(levels[pos + stride], MAX_BASE_BR_RANGE) +
            AOMMIN(levels[pos + 1 + stride], MAX_BASE_BR_RANGE);
  mag = AOMMIN((mag + 1) >> 1, 6);
  //((row | col) < 2) is equivalent to ((row < 2) && (col < 2))
  if ((row | col) < 2) return mag + 7;
  return mag + 14;
}